

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O0

Result __thiscall
tonk::gateway::SSDPRequester::OnUDPDatagram(SSDPRequester *this,char *data,uint bytes)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  istream *piVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  ErrorResult *in_RDI;
  Result result;
  ParsedURL parsed;
  string url;
  size_type begin;
  bool isLocation;
  string line;
  istream is;
  membuf sbuf;
  string *in_stack_fffffffffffffb08;
  ParsedURL *in_stack_fffffffffffffb10;
  char *in_stack_fffffffffffffb20;
  char *in_stack_fffffffffffffb28;
  allocator *paVar8;
  undefined7 in_stack_fffffffffffffb30;
  undefined1 in_stack_fffffffffffffb37;
  allocator local_3e9;
  string local_3e8 [32];
  char *local_3c8 [2];
  ParsedURL *in_stack_fffffffffffffc48;
  StateMachine *in_stack_fffffffffffffc50;
  string *in_stack_fffffffffffffcb8;
  ParsedURL *in_stack_fffffffffffffcc0;
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [32];
  long local_2c8;
  string local_2c0 [38];
  undefined1 local_29a;
  allocator local_299;
  string local_298 [32];
  undefined4 local_278;
  allocator local_271;
  string local_270 [32];
  string local_250 [48];
  istream local_220 [280];
  streambuf local_108 [96];
  char **local_a8;
  string *local_90;
  string *local_70;
  string *local_50;
  string *local_30;
  char *local_20;
  char *local_18;
  char **local_10;
  
  membuf::membuf((membuf *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                 in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
  std::istream::istream(local_220,local_108);
  std::__cxx11::string::string(local_250);
  piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,local_250);
  bVar1 = std::ios::operator!((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
  if ((bVar1 & 1) == 0) {
    lVar5 = std::__cxx11::string::find((char *)local_250,0x2dae77);
    if (lVar5 == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_298,"Ignoring malformed UDP response (No \"200 OK\")",&local_299);
      local_70 = local_298;
      pcVar6 = (char *)operator_new(0x38);
      ErrorResult::ErrorResult((ErrorResult *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
      in_RDI->Source = pcVar6;
      std::__cxx11::string::~string(local_298);
      std::allocator<char>::~allocator((allocator<char> *)&local_299);
      local_278 = 1;
    }
    else {
      do {
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,local_250)
        ;
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
        if (!bVar2) {
          paVar8 = &local_3e9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_3e8,"No location found",paVar8);
          local_30 = local_3e8;
          pcVar6 = (char *)operator_new(0x38);
          ErrorResult::ErrorResult
                    ((ErrorResult *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
          in_RDI->Source = pcVar6;
          std::__cxx11::string::~string(local_3e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
          local_278 = 1;
          goto LAB_0020c2e3;
        }
        std::__cxx11::string::substr((ulong)local_2c0,(ulong)local_250);
        local_18 = (char *)std::__cxx11::string::c_str();
        local_20 = "location:";
        iVar3 = strcasecmp(local_18,"location:");
        bVar2 = iVar3 == 0;
        std::__cxx11::string::~string(local_2c0);
        local_29a = bVar2;
      } while (!bVar2);
      local_2c8 = std::__cxx11::string::find((char *)local_250,0x2daeb6);
      if (local_2c8 == -1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_2e8,"Ignoring malformed UDP response (No protocol)",&local_2e9);
        local_50 = local_2e8;
        pcVar6 = (char *)operator_new(0x38);
        ErrorResult::ErrorResult((ErrorResult *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08)
        ;
        in_RDI->Source = pcVar6;
        std::__cxx11::string::~string(local_2e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
        local_278 = 1;
      }
      else {
        uVar7 = local_2c8 + 3;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_310,local_250,uVar7,&local_311);
        std::allocator<char>::~allocator((allocator<char> *)&local_311);
        trim((string *)0x20bff1);
        ParsedURL::ParsedURL
                  ((ParsedURL *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30));
        ParsedURL::Parse(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
        local_a8 = local_3c8;
        if (local_3c8[0] == (char *)0x0) {
          StateMachine::OnSSDPResponse(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
          Result::Success();
        }
        else {
          local_10 = local_3c8;
          in_RDI->Source = local_3c8[0];
          local_3c8[0] = (char *)0x0;
        }
        local_278 = 1;
        Result::~Result((Result *)in_stack_fffffffffffffb10);
        ParsedURL::~ParsedURL(in_stack_fffffffffffffb10);
        std::__cxx11::string::~string(local_310);
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_270,"Truncated UDP response",&local_271);
    local_90 = local_270;
    pcVar6 = (char *)operator_new(0x38);
    ErrorResult::ErrorResult((ErrorResult *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
    in_RDI->Source = pcVar6;
    std::__cxx11::string::~string(local_270);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
    local_278 = 1;
  }
LAB_0020c2e3:
  std::__cxx11::string::~string(local_250);
  std::istream::~istream(local_220);
  membuf::~membuf((membuf *)0x20c30a);
  return (Result)in_RDI;
}

Assistant:

Result SSDPRequester::OnUDPDatagram(char* data, unsigned bytes)
{
    membuf sbuf(data, data + bytes);
    std::istream is(&sbuf);

    std::string line;

    // Check if response starts with a success code
    if (!std::getline(is, line)) {
        return Result("Truncated UDP response");
    }
    if (line.find("200 OK") == std::string::npos) {
        return Result("Ignoring malformed UDP response (No \"200 OK\")");
    }

    //ModuleLogger.Info("**** ", SourceAddress.address().to_string(), ":", SourceAddress.port());

    // For each remaining line:
    while (std::getline(is, line))
    {
        //ModuleLogger.Info("LINE: ", line);

        const bool isLocation = (0 == StrCaseCompare(line.substr(0, 9).c_str(), "location:"));
        if (!isLocation) {
            continue;
        }

        // Parse out the first HTTP or HTTPS URL in the response.
        const std::string::size_type begin = line.find("://");
        if (begin == std::string::npos) {
            return Result("Ignoring malformed UDP response (No protocol)");
        }
        std::string url(line, begin + 3);
        trim(url);

        ParsedURL parsed;
        Result result = parsed.Parse(url);
        if (result.IsFail()) {
            return result;
        }

        State->OnSSDPResponse(parsed);
        return Result::Success();
    }

    return Result("No location found");
}